

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O3

string * __thiscall
t_haxe_generator::function_signature_combined_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_function *tfunction)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  string arguments;
  string resulttype;
  string on_error_success;
  string local_110;
  string local_f0;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 local_c0 [16];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  generate_service_method_onsuccess_abi_cxx11_(&local_110,this,tfunction,true,false);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x38dacc);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  argument_list_abi_cxx11_(&local_110,this,tfunction->arglist_);
  bVar2 = tfunction->oneway_;
  if ((bool)bVar2 == false) {
    iVar3 = std::__cxx11::string::compare((char *)&local_110);
    if (iVar3 != 0) {
      std::__cxx11::string::append((char *)&local_110);
    }
    std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_b0);
    bVar2 = tfunction->oneway_;
  }
  local_c8 = (char *)0x0;
  local_c0[0] = 0;
  local_d0 = local_c0;
  if (((bVar2 & 1) == 0) &&
     (iVar3 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])(), (char)iVar3 == '\0')) {
    type_name_abi_cxx11_(&local_f0,this,tfunction->returntype_,false,false);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x38d1ef);
  }
  std::operator+(&local_50,"function ",&tfunction->name_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)local_110._M_dataplus._M_p);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_f0.field_2._M_allocated_capacity = *psVar6;
    local_f0.field_2._8_8_ = plVar4[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar6;
    local_f0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_f0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar1 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::function_signature_combined(t_function* tfunction) {
  std::string on_error_success = "onError : Dynamic->Void = null, "
                                 + generate_service_method_onsuccess(tfunction, true, false);

  std::string arguments = argument_list(tfunction->get_arglist());
  if (!tfunction->is_oneway()) {
    if (arguments != "") {
      arguments += ", ";
    }
    arguments += on_error_success; //"onError : Function, onSuccess : Function";
  }

  std::string resulttype;
  if (tfunction->is_oneway() || tfunction->get_returntype()->is_void()) {
    resulttype = "Void";
  } else {
    resulttype = type_name(tfunction->get_returntype());
  }

  std::string result = "function " + tfunction->get_name() + "(" + arguments + ") : "+resulttype;
  return result;
}